

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

size_t UA_calcSizeBinary(void *p,UA_DataType *type)

{
  byte bVar1;
  UA_DataTypeMember *pUVar2;
  ulong uVar3;
  size_t sVar4;
  UA_DataType *type_00;
  long lVar5;
  size_t sVar6;
  size_t *psVar7;
  UA_DataType *typelists [2];
  
  bVar1 = type->membersSize;
  typelists[1] = type;
  typelists[0] = type + -(ulong)type->typeIndex;
  if (bVar1 == 0) {
    sVar6 = 0;
  }
  else {
    lVar5 = 0;
    sVar6 = 0;
    do {
      pUVar2 = typelists[1]->members;
      type_00 = (UA_DataType *)
                ((long)&typelists[(ulong)(~(uint)(byte)(&pUVar2->field_0xb)[lVar5] & 1) - 1]->
                        typeName +
                (ulong)((uint)*(ushort *)((long)&pUVar2->memberTypeIndex + lVar5) * 0x30));
      psVar7 = (size_t *)((ulong)(&pUVar2->padding)[lVar5] + (long)p);
      if (((&pUVar2->field_0xb)[lVar5] & 2) == 0) {
        uVar3 = 0x19;
        if ((type_00->field_0x25 & 1) != 0) {
          uVar3 = (ulong)type_00->typeIndex;
        }
        sVar4 = (*(code *)(&calcSizeBinaryJumpTable)[uVar3])(psVar7,type_00);
        uVar3 = (ulong)type_00->memSize;
      }
      else {
        sVar4 = Array_calcSizeBinary((void *)psVar7[1],*psVar7,type_00);
        uVar3 = 0x10;
      }
      sVar6 = sVar6 + sVar4;
      p = (void *)((long)psVar7 + uVar3);
      lVar5 = lVar5 + 0x10;
    } while ((ulong)bVar1 * 0x10 != lVar5);
  }
  return sVar6;
}

Assistant:

size_t
UA_calcSizeBinary(void *p, const UA_DataType *type) {
    size_t s = 0;
    uintptr_t ptr = (uintptr_t)p;
    UA_Byte membersSize = type->membersSize;
    const UA_DataType *typelists[2] = { UA_TYPES, &type[-type->typeIndex] };
    for(size_t i = 0; i < membersSize; ++i) {
        const UA_DataTypeMember *member = &type->members[i];
        const UA_DataType *membertype = &typelists[!member->namespaceZero][member->memberTypeIndex];
        if(!member->isArray) {
            ptr += member->padding;
            size_t encode_index = membertype->builtin ? membertype->typeIndex : UA_BUILTIN_TYPES_COUNT;
            s += calcSizeBinaryJumpTable[encode_index]((const void*)ptr, membertype);
            ptr += membertype->memSize;
        } else {
            ptr += member->padding;
            const size_t length = *((const size_t*)ptr);
            ptr += sizeof(size_t);
            s += Array_calcSizeBinary(*(void *UA_RESTRICT const *)ptr, length, membertype);
            ptr += sizeof(void*);
        }
    }
    return s;
}